

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryCompileCommand.cxx
# Opt level: O0

void anon_unknown.dwarf_cb7ea8::WriteTryCompileEvent
               (cmConfigureLog *log,cmMakefile *mf,cmTryCompileResult *compileResult)

{
  initializer_list<unsigned_long> __l;
  cmMakefile *this;
  bool bVar1;
  int iVar2;
  allocator<char> local_71;
  string local_70;
  allocator<unsigned_long> local_39;
  unsigned_long local_38;
  iterator local_30;
  size_type local_28;
  cmTryCompileResult *local_20;
  cmTryCompileResult *compileResult_local;
  cmMakefile *mf_local;
  cmConfigureLog *log_local;
  
  local_20 = compileResult;
  compileResult_local = (cmTryCompileResult *)mf;
  mf_local = (cmMakefile *)log;
  if (((anonymous_namespace)::
       WriteTryCompileEvent(cmConfigureLog&,cmMakefile_const&,cmTryCompileResult_const&)::
       LogVersionsWithTryCompileV1 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   WriteTryCompileEvent(cmConfigureLog&,cmMakefile_const&,cmTryCompileResult_const&)
                                   ::LogVersionsWithTryCompileV1), iVar2 != 0)) {
    local_38 = 1;
    local_30 = &local_38;
    local_28 = 1;
    std::allocator<unsigned_long>::allocator(&local_39);
    __l._M_len = local_28;
    __l._M_array = local_30;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&WriteTryCompileEvent::LogVersionsWithTryCompileV1,__l,&local_39);
    std::allocator<unsigned_long>::~allocator(&local_39);
    __cxa_atexit(std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector,
                 &WriteTryCompileEvent::LogVersionsWithTryCompileV1,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         WriteTryCompileEvent(cmConfigureLog&,cmMakefile_const&,cmTryCompileResult_const&)
                         ::LogVersionsWithTryCompileV1);
  }
  bVar1 = cmConfigureLog::IsAnyLogVersionEnabled
                    ((cmConfigureLog *)mf_local,&WriteTryCompileEvent::LogVersionsWithTryCompileV1);
  this = mf_local;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"try_compile-v1",&local_71);
    cmConfigureLog::BeginEvent((cmConfigureLog *)this,&local_70,(cmMakefile *)compileResult_local);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    cmCoreTryCompile::WriteTryCompileEventFields((cmConfigureLog *)mf_local,local_20);
    cmConfigureLog::EndEvent((cmConfigureLog *)mf_local);
  }
  return;
}

Assistant:

void WriteTryCompileEvent(cmConfigureLog& log, cmMakefile const& mf,
                          cmTryCompileResult const& compileResult)
{
  // Keep in sync with cmFileAPIConfigureLog's DumpEventKindNames.
  static const std::vector<unsigned long> LogVersionsWithTryCompileV1{ 1 };

  if (log.IsAnyLogVersionEnabled(LogVersionsWithTryCompileV1)) {
    log.BeginEvent("try_compile-v1", mf);
    cmCoreTryCompile::WriteTryCompileEventFields(log, compileResult);
    log.EndEvent();
  }
}